

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O0

string * __thiscall
TracerouteRunner::get_output_line_abi_cxx11_(string *__return_storage_ptr__,TracerouteRunner *this)

{
  int iVar1;
  reference pvVar2;
  out_of_range *err;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  TracerouteRunner *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_results);
  iVar1 = this->output_position;
  this->output_position = iVar1 + 1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&this->results,(long)iVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string TracerouteRunner::get_output_line() {
	try {
		std::lock_guard<std::mutex> lock(this->mutex_results);
		return this->results.at(this->output_position++);
	} catch (const std::out_of_range& err) {
		std::cerr << "Out of Range Error: " << err.what() << std::endl;
		exit(1);
	}
}